

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::LifetimeTests::details::FboOutputAttacher::setupContainer
          (FboOutputAttacher *this,GLuint seed,GLuint fbo)

{
  ostringstream *this_00;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  setupFbo(&(this->super_OutputAttacher).super_ContextWrapper.m_ctx,seed,fbo);
  local_198._0_8_ = ((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"// Drew to framebuffer ",0x17);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," with seed ",0xb);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void FboOutputAttacher::setupContainer (GLuint seed, GLuint fbo)
{
	setupFbo(getContext(), seed, fbo);
	log() << TestLog::Message
		  << "// Drew to framebuffer " << fbo << " with seed " << seed << "."
		  << TestLog::EndMessage;
}